

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void subtract_average_avx2
               (uint16_t *src_ptr,int16_t *dst_ptr,int width,int height,int round_offset,
               int num_pel_log2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar7 [16];
  __m256i *dst;
  __m256i avg_epi16;
  __m256i fill;
  __m256i l1;
  __m256i l0;
  __m256i sum2;
  __m256i sum;
  int step;
  __m256i *end;
  __m256i *src;
  undefined1 in_stack_fffffffffffffa60 [24];
  undefined8 *local_528;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 (*local_438) [32];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  ulong uStack_2d8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_480 = ZEXT1632(ZEXT816(0));
  local_438 = in_RDI;
  if (in_EDX == 0x20) {
    uStack_2d8 = SUB328(ZEXT832(0),4);
    local_4a0 = ZEXT832(uStack_2d8) << 0x40;
  }
  do {
    auVar3 = vpaddw_avx2(*local_438,local_438[2]);
    local_4c0 = auVar3._0_8_;
    uStack_4b8 = auVar3._8_8_;
    uStack_4b0 = auVar3._16_8_;
    uStack_4a8 = auVar3._24_8_;
    a[1] = in_stack_fffffffffffffa60._0_8_;
    a[2] = in_stack_fffffffffffffa60._8_8_;
    a[3] = in_stack_fffffffffffffa60._16_8_;
    a[0] = 0x9a2d8f;
    _mm256_addl_epi16(a);
    auVar3._8_8_ = uStack_4b8;
    auVar3._0_8_ = local_4c0;
    auVar3._16_8_ = uStack_4b0;
    auVar3._24_8_ = uStack_4a8;
    local_480 = vpaddd_avx2(local_480,auVar3);
    if (in_EDX == 0x20) {
      auVar3 = vpaddw_avx2(local_438[1],local_438[3]);
      local_4e0 = auVar3._0_8_;
      uStack_4d8 = auVar3._8_8_;
      uStack_4d0 = auVar3._16_8_;
      uStack_4c8 = auVar3._24_8_;
      a_00[1] = in_stack_fffffffffffffa60._0_8_;
      a_00[2] = in_stack_fffffffffffffa60._8_8_;
      a_00[3] = in_stack_fffffffffffffa60._16_8_;
      a_00[0] = 0x9a2e66;
      _mm256_addl_epi16(a_00);
      auVar4._8_8_ = uStack_4d8;
      auVar4._0_8_ = local_4e0;
      auVar4._16_8_ = uStack_4d0;
      auVar4._24_8_ = uStack_4c8;
      local_4a0 = vpaddd_avx2(local_4a0,auVar4);
    }
    local_438 = local_438 + 4;
  } while (local_438 < in_RDI + in_ECX * 2);
  if (in_EDX == 0x20) {
    local_480 = vpaddd_avx2(local_480,local_4a0);
  }
  a_01[1] = in_stack_fffffffffffffa60._0_8_;
  a_01[2] = in_stack_fffffffffffffa60._8_8_;
  a_01[3] = in_stack_fffffffffffffa60._16_8_;
  a_01[0] = 0x9a2f24;
  fill_sum_epi32(a_01);
  auVar1 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
  auVar1 = vpinsrd_avx(auVar1,in_R8D,2);
  auVar1 = vpinsrd_avx(auVar1,in_R8D,3);
  auVar2 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
  auVar2 = vpinsrd_avx(auVar2,in_R8D,2);
  auVar2 = vpinsrd_avx(auVar2,in_R8D,3);
  auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_70 = auVar7._0_8_;
  uStack_68 = auVar7._8_8_;
  auVar6._8_8_ = local_480._8_8_;
  auVar6._0_8_ = local_480._0_8_;
  auVar6._16_8_ = local_480._16_8_;
  auVar6._24_8_ = local_480._24_8_;
  auVar5._16_8_ = uStack_70;
  auVar5._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar5._24_8_ = uStack_68;
  auVar3 = vpaddd_avx2(auVar6,auVar5);
  auVar3 = vpsrld_avx2(auVar3,ZEXT416(in_R9D));
  auVar3 = vpackssdw_avx2(auVar3,auVar3);
  local_528 = in_RSI;
  local_438 = in_RDI;
  do {
    auVar4 = vpsubw_avx2(*local_438,auVar3);
    local_320 = auVar4._0_8_;
    uStack_318 = auVar4._8_8_;
    uStack_310 = auVar4._16_8_;
    uStack_308 = auVar4._24_8_;
    *local_528 = local_320;
    local_528[1] = uStack_318;
    local_528[2] = uStack_310;
    local_528[3] = uStack_308;
    if (in_EDX == 0x20) {
      auVar4 = vpsubw_avx2(local_438[1],auVar3);
      local_360 = auVar4._0_8_;
      uStack_358 = auVar4._8_8_;
      uStack_350 = auVar4._16_8_;
      uStack_348 = auVar4._24_8_;
      local_528[4] = local_360;
      local_528[5] = uStack_358;
      local_528[6] = uStack_350;
      local_528[7] = uStack_348;
    }
    local_438 = local_438 + 2;
    local_528 = local_528 + 8;
  } while (local_438 < in_RDI + in_ECX * 2);
  return;
}

Assistant:

static inline void subtract_average_avx2(const uint16_t *src_ptr,
                                         int16_t *dst_ptr, int width,
                                         int height, int round_offset,
                                         int num_pel_log2) {
  // Use SSE2 version for smaller widths
  assert(width == 16 || width == 32);

  const __m256i *src = (__m256i *)src_ptr;
  const __m256i *const end = src + height * CFL_BUF_LINE_I256;
  // To maximize usage of the AVX2 registers, we sum two rows per loop
  // iteration
  const int step = 2 * CFL_BUF_LINE_I256;

  __m256i sum = _mm256_setzero_si256();
  // For width 32, we use a second sum accumulator to reduce accumulator
  // dependencies in the loop.
  __m256i sum2;
  if (width == 32) sum2 = _mm256_setzero_si256();

  do {
    // Add top row to the bottom row
    __m256i l0 = _mm256_add_epi16(_mm256_loadu_si256(src),
                                  _mm256_loadu_si256(src + CFL_BUF_LINE_I256));
    sum = _mm256_add_epi32(sum, _mm256_addl_epi16(l0));
    if (width == 32) { /* Don't worry, this if it gets optimized out. */
      // Add the second part of the top row to the second part of the bottom row
      __m256i l1 =
          _mm256_add_epi16(_mm256_loadu_si256(src + 1),
                           _mm256_loadu_si256(src + 1 + CFL_BUF_LINE_I256));
      sum2 = _mm256_add_epi32(sum2, _mm256_addl_epi16(l1));
    }
    src += step;
  } while (src < end);
  // Combine both sum accumulators
  if (width == 32) sum = _mm256_add_epi32(sum, sum2);

  __m256i fill = fill_sum_epi32(sum);

  __m256i avg_epi16 = _mm256_srli_epi32(
      _mm256_add_epi32(fill, _mm256_set1_epi32(round_offset)), num_pel_log2);
  avg_epi16 = _mm256_packs_epi32(avg_epi16, avg_epi16);

  // Store and subtract loop
  src = (__m256i *)src_ptr;
  __m256i *dst = (__m256i *)dst_ptr;
  do {
    _mm256_storeu_si256(dst,
                        _mm256_sub_epi16(_mm256_loadu_si256(src), avg_epi16));
    if (width == 32) {
      _mm256_storeu_si256(
          dst + 1, _mm256_sub_epi16(_mm256_loadu_si256(src + 1), avg_epi16));
    }
    src += CFL_BUF_LINE_I256;
    dst += CFL_BUF_LINE_I256;
  } while (src < end);
}